

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftsnames.c
# Opt level: O3

FT_Error FT_Get_Sfnt_LangTag(FT_Face face,FT_UInt langID,FT_SfntLangTag *alangTag)

{
  ushort *puVar1;
  FT_Memory pFVar2;
  FT_Stream stream;
  FT_Error FVar3;
  FT_Byte *buffer;
  unsigned_long uVar4;
  FT_UInt FVar5;
  ulong uVar6;
  
  if ((face == (FT_Face)0x0 || alangTag == (FT_SfntLangTag *)0x0) || ((face->face_flags & 8) == 0))
  {
    return 6;
  }
  if ((short)face[2].num_charmaps != 1) {
    return 8;
  }
  if (langID < 0x8001) {
    return 6;
  }
  if (*(uint *)&face[2].generic.finalizer <= langID - 0x8000) {
    return 6;
  }
  puVar1 = (ushort *)(face[2].bbox.xMin + (ulong)(langID - 0x8000) * 0x18);
  uVar6 = (ulong)*puVar1;
  FVar5 = (FT_UInt)*puVar1;
  if (uVar6 != 0) {
    if (*(long *)(puVar1 + 8) != 0) goto LAB_001f02a1;
    pFVar2 = face->memory;
    stream = face->stream;
    buffer = (FT_Byte *)(*pFVar2->alloc)(pFVar2,uVar6);
    if (buffer != (FT_Byte *)0x0) {
      memset(buffer,0,uVar6);
      *(FT_Byte **)(puVar1 + 8) = buffer;
      uVar6 = *(ulong *)(puVar1 + 4);
      if (stream->read == (FT_Stream_IoFunc)0x0) {
        if (uVar6 <= stream->size) goto LAB_001f0265;
      }
      else {
        uVar4 = (*stream->read)(stream,uVar6,(uchar *)0x0,0);
        buffer = *(FT_Byte **)(puVar1 + 8);
        if (uVar4 == 0) {
LAB_001f0265:
          stream->pos = uVar6;
          FVar3 = FT_Stream_Read(stream,buffer,(ulong)*puVar1);
          if (FVar3 == 0) {
            FVar5 = (FT_UInt)*puVar1;
            goto LAB_001f02a1;
          }
          buffer = *(FT_Byte **)(puVar1 + 8);
        }
        if (buffer == (FT_Byte *)0x0) goto LAB_001f0290;
      }
      (*pFVar2->free)(pFVar2,buffer);
    }
LAB_001f0290:
    puVar1[8] = 0;
    puVar1[9] = 0;
    puVar1[10] = 0;
    puVar1[0xb] = 0;
    *puVar1 = 0;
  }
  FVar5 = 0;
LAB_001f02a1:
  alangTag->string = *(FT_Byte **)(puVar1 + 8);
  alangTag->string_len = FVar5;
  return 0;
}

Assistant:

FT_EXPORT_DEF( FT_Error )
  FT_Get_Sfnt_LangTag( FT_Face          face,
                       FT_UInt          langID,
                       FT_SfntLangTag  *alangTag )
  {
    FT_Error  error = FT_ERR( Invalid_Argument );


    if ( alangTag && face && FT_IS_SFNT( face ) )
    {
      TT_Face  ttface = (TT_Face)face;


      if ( ttface->name_table.format != 1 )
        return FT_THROW( Invalid_Table );

      if ( langID > 0x8000U                                        &&
           langID - 0x8000U < ttface->name_table.numLangTagRecords )
      {
        TT_LangTag  entry = ttface->name_table.langTags +
                            ( langID - 0x8000U );


        /* load name on demand */
        if ( entry->stringLength > 0 && !entry->string )
        {
          FT_Memory  memory = face->memory;
          FT_Stream  stream = face->stream;


          if ( FT_NEW_ARRAY  ( entry->string, entry->stringLength ) ||
               FT_STREAM_SEEK( entry->stringOffset )                ||
               FT_STREAM_READ( entry->string, entry->stringLength ) )
          {
            FT_FREE( entry->string );
            entry->stringLength = 0;
          }
        }

        alangTag->string     = (FT_Byte*)entry->string;
        alangTag->string_len = entry->stringLength;

        error = FT_Err_Ok;
      }
    }

    return error;
  }